

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.cpp
# Opt level: O0

void __thiscall
wasm::ModuleUtils::getOptimizedIndexedHeapTypes(wasm::Module&)::GroupInfoMap::sort(std::vector<wasm
::RecGroup,std::allocator<wasm::RecGroup>_>__
          (void *this,vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_> *groups)

{
  iterator __first;
  iterator __last;
  vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_> *groups_local;
  GroupInfoMap *this_local;
  
  __first = std::vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_>::begin(groups);
  __last = std::vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_>::end(groups);
  std::
  sort<__gnu_cxx::__normal_iterator<wasm::RecGroup*,std::vector<wasm::RecGroup,std::allocator<wasm::RecGroup>>>,wasm::ModuleUtils::getOptimizedIndexedHeapTypes(wasm::Module&)::GroupInfoMap::sort(std::vector<wasm::RecGroup,std::allocator<wasm::RecGroup>>&)::_lambda(auto:1&,auto:2&)_1_>
            ((__normal_iterator<wasm::RecGroup_*,_std::vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_>_>
              )__first._M_current,
             (__normal_iterator<wasm::RecGroup_*,_std::vector<wasm::RecGroup,_std::allocator<wasm::RecGroup>_>_>
              )__last._M_current,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void sort(std::vector<RecGroup>& groups) {
      std::sort(groups.begin(), groups.end(), [&](auto& a, auto& b) {
        return this->at(a) < this->at(b);
      });
    }